

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O2

void printBits(ostream *os,float f)

{
  int i;
  uint uVar1;
  
  for (uVar1 = 0x1f; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    std::operator<<(os,(((uint)f >> (uVar1 & 0x1f) & 1) != 0) + '0');
    if ((uVar1 & 0x7ffffff7) == 0x17) {
      std::operator<<(os,' ');
    }
  }
  return;
}

Assistant:

HALF_EXPORT void
printBits (ostream &os, float f)
{
    half::uif x;
    x.f = f;

    for (int i = 31; i >= 0; i--)
    {
	os << (((x.i >> i) & 1)? '1': '0');

	if (i == 31 || i == 23)
	    os << ' ';
    }
}